

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  char *__s;
  uchar *outstart;
  uchar *puVar8;
  byte *pbVar9;
  byte *pbVar10;
  char nbuf [16];
  int local_70;
  int local_60;
  char local_48 [24];
  
  iVar3 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      local_60 = 0;
      iVar3 = 0;
    }
    else {
      local_60 = (int)in;
      local_70 = (int)out;
      if (0 < (long)*inlen) {
        pbVar10 = in + *inlen;
        puVar8 = out + *outlen;
        do {
          bVar1 = *in;
          uVar7 = (uint)bVar1;
          uVar4 = 0;
          if ((char)bVar1 < '\0') {
            if (bVar1 < 0xc0) {
LAB_0014a0e2:
              *outlen = (int)out - local_70;
              local_60 = (int)in - local_60;
              iVar3 = -2;
              goto LAB_0014a0d0;
            }
            if (bVar1 < 0xe0) {
              uVar7 = bVar1 & 0x1f;
              uVar4 = 1;
            }
            else if (bVar1 < 0xf0) {
              uVar7 = bVar1 & 0xf;
              uVar4 = 2;
            }
            else {
              if (0xf7 < bVar1) goto LAB_0014a0e2;
              uVar7 = bVar1 & 7;
              uVar4 = 3;
            }
          }
          pbVar9 = in + 1;
          if ((long)pbVar10 - (long)pbVar9 < (long)(ulong)uVar4) break;
          if (pbVar9 < pbVar10 && (char)bVar1 < '\0') {
            pbVar2 = in + 2;
            do {
              pbVar9 = pbVar2;
              uVar4 = uVar4 - 1;
              if (((pbVar9[-1] & 0xffffffc0) != 0x80) ||
                 (uVar7 = pbVar9[-1] & 0x3f | uVar7 << 6, uVar4 == 0)) break;
              pbVar2 = pbVar9 + 1;
            } while (pbVar9 < pbVar10);
          }
          if (uVar7 < 0x80) {
            if (puVar8 <= out + 1) break;
            *out = (uchar)uVar7;
            out = out + 1;
          }
          else {
            lVar5 = 0;
            do {
              uVar4 = *(uint *)((long)&html40EntitiesTable[0].value + lVar5);
              if (uVar7 <= uVar4) {
                if (uVar4 <= uVar7) {
                  lVar5 = (long)&html40EntitiesTable[0].value + lVar5;
                  goto LAB_0014a026;
                }
                break;
              }
              lVar5 = lVar5 + 0x18;
            } while (lVar5 != 0x17b8);
            lVar5 = 0;
LAB_0014a026:
            if (lVar5 == 0) {
              __s = local_48;
              snprintf(__s,0x10,"#%u");
            }
            else {
              __s = *(char **)(lVar5 + 8);
            }
            sVar6 = strlen(__s);
            sVar6 = (size_t)(int)sVar6;
            if (puVar8 <= out + sVar6 + 2) break;
            *out = '&';
            memcpy(out + 1,__s,sVar6);
            out[sVar6 + 1] = ';';
            out = out + sVar6 + 2;
          }
          in = pbVar9;
        } while (pbVar9 < pbVar10);
      }
      *outlen = (int)out - local_70;
      local_60 = (int)in - local_60;
      iVar3 = 0;
    }
LAB_0014a0d0:
    *inlen = local_60;
  }
  return iVar3;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
		break;
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c < 0x80) {
	    if (out + 1 >= outend)
		break;
	    *out++ = c;
	} else {
	    int len;
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */

	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
	      snprintf(nbuf, sizeof(nbuf), "#%u", c);
	      cp = nbuf;
	    }
	    else
	      cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len >= outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}